

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_connection.cc
# Opt level: O2

void __thiscall QuickConnection::ConnectToServer(QuickConnection *this)

{
  QuicClock *pQVar1;
  int iVar2;
  undefined4 extraout_var;
  QuickHello msg;
  
  pQVar1 = (this->_clock)._M_t.
           super___uniq_ptr_impl<quic::QuicClock,_std::default_delete<quic::QuicClock>_>._M_t.
           super__Tuple_impl<0UL,_quic::QuicClock_*,_std::default_delete<quic::QuicClock>_>.
           super__Head_base<0UL,_quic::QuicClock_*,_false>._M_head_impl;
  if (pQVar1 != (QuicClock *)0x0) {
    iVar2 = (*pQVar1->_vptr_QuicClock[3])();
    this->_reconnect_time = CONCAT44(extraout_var,iVar2);
    msg.msg_id = '\x01';
    msg.session_id = this->_session_id;
    Send(this,&msg,5);
  }
  return;
}

Assistant:

void QuickConnection::ConnectToServer()
{
	if (_clock == nullptr)
		return;
	_reconnect_time = _clock->Now().ToDebuggingValue();
	QuickHello msg;
	msg.session_id = _session_id;
	Send(&msg, sizeof(msg));
}